

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O0

void report_bogus_stmt_list_form(Dwarf_Debug dbg,Dwarf_Half attrform,Dwarf_Error *error)

{
  char *pcVar1;
  char *local_90;
  char *formname;
  char buf [32];
  undefined1 local_60 [8];
  dwarfstring f;
  dwarfstring m;
  Dwarf_Error *error_local;
  Dwarf_Half attrform_local;
  Dwarf_Debug dbg_local;
  
  local_90 = (char *)0x0;
  formname._0_1_ = 0;
  dwarfstring_constructor_static((dwarfstring_s *)local_60,(char *)&formname,0x20);
  dwarf_get_FORM_name((uint)attrform,&local_90);
  if (local_90 == (char *)0x0) {
    dwarfstring_append_printf_u((dwarfstring *)local_60,"Invalid Form Code  0xllx",(ulong)attrform);
  }
  else {
    dwarfstring_append((dwarfstring_s *)local_60,local_90);
  }
  dwarfstring_constructor_fixed((dwarfstring_s *)&f.s_malloc,200);
  pcVar1 = dwarfstring_string((dwarfstring_s *)local_60);
  dwarfstring_append_printf_s
            ((dwarfstring *)&f.s_malloc,
             "DW_DLE_LINE_OFFSET_WRONG_FORM: form %s instead of an allowed section offset form.",
             pcVar1);
  pcVar1 = dwarfstring_string((dwarfstring_s *)&f.s_malloc);
  _dwarf_error_string(dbg,error,0x150,pcVar1);
  dwarfstring_destructor((dwarfstring_s *)&f.s_malloc);
  dwarfstring_destructor((dwarfstring_s *)local_60);
  return;
}

Assistant:

static void
report_bogus_stmt_list_form(Dwarf_Debug dbg,
    Dwarf_Half attrform, Dwarf_Error *error)
{
    dwarfstring m; /* OK constructor_fixed  */
    dwarfstring f; /* Ok constructor_static */
    char buf[32];
    const char *formname = 0;

    buf[0] = 0;
    dwarfstring_constructor_static(&f,buf,sizeof(buf));
    dwarf_get_FORM_name(attrform,&formname);
    if (!formname) {
        dwarfstring_append_printf_u(&f,"Invalid Form Code "
            " 0x" DW_PR_DUx,attrform);
    } else {
        dwarfstring_append(&f,(char *)formname);
    }
    dwarfstring_constructor_fixed(&m,200);
    dwarfstring_append_printf_s(&m,
        "DW_DLE_LINE_OFFSET_WRONG_FORM: form %s "
        "instead of an allowed section offset form.",
        dwarfstring_string(&f));
    _dwarf_error_string(dbg, error, DW_DLE_LINE_OFFSET_WRONG_FORM,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
    dwarfstring_destructor(&f);
}